

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::removeUnusedMaterials(Geometry *this)

{
  long *plVar1;
  ushort uVar2;
  uint32 uVar3;
  MeshHeader *pMVar4;
  Material *mat;
  undefined8 uVar5;
  Triangle *pTVar6;
  int32 iVar7;
  long lVar8;
  Material **ppMVar9;
  MeshHeader *this_00;
  MeshHeader *pMVar10;
  ulong uVar11;
  int32 i;
  ulong uVar12;
  MeshHeader *pMVar13;
  int numMeshes;
  long lVar14;
  
  pMVar4 = this->meshHeader;
  if (pMVar4 != (MeshHeader *)0x0) {
    lVar8 = 0;
    do {
      if ((ulong)pMVar4->numMeshes * 0x18 + 0x18 == lVar8 + 0x18) {
        allocLocation =
             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 635"
        ;
        lVar8 = (*DAT_00143848)((long)(this->matList).numMaterials << 2,0x1000f);
        allocLocation =
             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 637"
        ;
        ppMVar9 = (Material **)(*DAT_00143848)((long)(this->matList).numMaterials << 3,0x30007);
        uVar2 = pMVar4->numMeshes;
        numMeshes = 0;
        for (lVar14 = 0; (ulong)uVar2 * 0x18 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
          if (*(int *)((long)&pMVar4[1].totalIndices + lVar14) != 0) {
            mat = *(Material **)((long)&pMVar4[2].flags + lVar14);
            ppMVar9[numMeshes] = mat;
            mat->refCount = mat->refCount + 1;
            iVar7 = MaterialList::findIndex(&this->matList,mat);
            *(int *)(lVar8 + (long)iVar7 * 4) = numMeshes;
            numMeshes = numMeshes + 1;
          }
        }
        for (lVar14 = 0; lVar14 < (this->matList).numMaterials; lVar14 = lVar14 + 1) {
          Material::destroy((this->matList).materials[lVar14]);
        }
        (*DAT_00143840)((this->matList).materials);
        (this->matList).materials = ppMVar9;
        (this->matList).space = (this->matList).numMaterials;
        (this->matList).numMaterials = numMeshes;
        this->meshHeader = (MeshHeader *)0x0;
        this_00 = allocateMeshes(this,numMeshes,pMVar4->totalIndices,0);
        this_00->flags = pMVar4->flags;
        pMVar13 = this_00 + 1;
        uVar2 = pMVar4->numMeshes;
        pMVar10 = pMVar13;
        for (lVar14 = 0; (ulong)uVar2 * 0x18 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
          uVar3 = *(uint32 *)((long)&pMVar4[1].totalIndices + lVar14);
          if (uVar3 != 0) {
            pMVar10->totalIndices = uVar3;
            uVar5 = *(undefined8 *)((long)&pMVar4[2].flags + lVar14);
            pMVar10[1].flags = (int)uVar5;
            pMVar10[1].numMeshes = (short)((ulong)uVar5 >> 0x20);
            pMVar10[1].serialNum = (short)((ulong)uVar5 >> 0x30);
            pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
          }
        }
        MeshHeader::setupIndices(this_00);
        pMVar10 = pMVar4;
        for (uVar12 = 0; uVar12 < pMVar4->numMeshes; uVar12 = uVar12 + 1) {
          uVar11 = (ulong)pMVar10[1].totalIndices;
          if (uVar11 != 0) {
            memcpy(*(void **)pMVar13,*(void **)(pMVar10 + 1),uVar11 * 2);
            pMVar13 = (MeshHeader *)&pMVar13[1].totalIndices;
          }
          pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
        }
        (*DAT_00143840)(pMVar4);
        pTVar6 = this->triangles;
        uVar11 = 0;
        uVar12 = (ulong)(uint)this->numTriangles;
        if (this->numTriangles < 1) {
          uVar12 = uVar11;
        }
        for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          pTVar6[uVar11].matId = *(uint16 *)(lVar8 + (ulong)pTVar6[uVar11].matId * 4);
        }
        (*DAT_00143840)();
        return;
      }
      plVar1 = (long *)((long)&pMVar4[1].flags + lVar8);
      lVar8 = lVar8 + 0x18;
    } while (*plVar1 != 0);
  }
  return;
}

Assistant:

void
Geometry::removeUnusedMaterials(void)
{
	if(this->meshHeader == nil)
		return;
	MeshHeader *mh = this->meshHeader;
	Mesh *m = mh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++)
		if(m[i].indices == nil)
			return;

	int32 *map = rwNewT(int32, this->matList.numMaterials,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	Material **materials = rwNewT(Material*,this->matList.numMaterials,
		MEMDUR_EVENT | ID_MATERIAL);
	int32 numMaterials = 0;
	/* Build new material list and map */
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		materials[numMaterials] = m[i].material;
		m[i].material->addRef();
		int32 oldid = this->matList.findIndex(m[i].material);
		map[oldid] = numMaterials;
		numMaterials++;
	}
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		this->matList.materials[i]->destroy();
	rwFree(this->matList.materials);
	this->matList.materials = materials;
	this->matList.space = this->matList.numMaterials;
	this->matList.numMaterials = numMaterials;

	/* Build new meshes */
	this->meshHeader = nil;
	MeshHeader *newmh = this->allocateMeshes(numMaterials, mh->totalIndices, 0);
	newmh->flags = mh->flags;
	Mesh *newm = newmh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		newm->numIndices = m[i].numIndices;
		newm->material = m[i].material;
		newm++;
	}
	newmh->setupIndices();
	/* Copy indices */
	newm = newmh->getMeshes();;
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		memcpy(newm->indices, m[i].indices,
		       m[i].numIndices*sizeof(*m[i].indices));
		newm++;
	}
	rwFree(mh);

	/* Remap triangle material IDs */
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = map[this->triangles[i].matId];
	rwFree(map);
}